

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::swap(dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
       *this,dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
             *ht)

{
  dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  *in_RSI;
  dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  
  std::
  swap<google::dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Settings>
            (&in_RDI->settings,&in_RSI->settings);
  std::
  swap<google::dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::KeyInfo>
            (&in_RDI->key_info,&in_RSI->key_info);
  std::swap<unsigned_long>(&in_RDI->num_deleted,&in_RSI->num_deleted);
  std::swap<unsigned_long>(&in_RDI->num_elements,&in_RSI->num_elements);
  std::swap<unsigned_long>(&in_RDI->num_buckets,&in_RSI->num_buckets);
  std::swap<int*>(&in_RDI->table,&in_RSI->table);
  bucket_count(in_RDI);
  sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)in_RDI,
                   in_stack_ffffffffffffffd8);
  bucket_count(in_RSI);
  sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)in_RDI,
                   in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void swap(dense_hashtable& ht) {
    std::swap(settings, ht.settings);
    std::swap(key_info, ht.key_info);
    std::swap(num_deleted, ht.num_deleted);
    std::swap(num_elements, ht.num_elements);
    std::swap(num_buckets, ht.num_buckets);
    std::swap(table, ht.table);
    settings.reset_thresholds(bucket_count());  // also resets consider_shrink
    ht.settings.reset_thresholds(ht.bucket_count());
    // we purposefully don't swap the allocator, which may not be swap-able
  }